

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::Transpose(Matrix *this)

{
  int cols;
  int rows;
  double *pdVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  Matrix *in_RSI;
  double dVar3;
  Matrix MVar4;
  undefined4 local_2c;
  undefined4 local_28;
  int j;
  int i;
  int n;
  int m;
  Matrix *this_local;
  Matrix *T;
  
  cols = GetRows(in_RSI);
  rows = GetCols(in_RSI);
  Matrix(this,rows,cols);
  uVar2 = extraout_RDX;
  for (local_28 = 0; local_28 < rows; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < cols; local_2c = local_2c + 1) {
      dVar3 = operator()(in_RSI,local_2c,local_28);
      pdVar1 = operator()(this,local_28,local_2c);
      *pdVar1 = dVar3;
      uVar2 = extraout_RDX_00;
    }
  }
  MVar4.rows = (int)uVar2;
  MVar4.cols = (int)((ulong)uVar2 >> 0x20);
  MVar4.data = (double *)this;
  return MVar4;
}

Assistant:

Matrix Matrix::Transpose() const
{
    int m = GetRows();
    int n = GetCols();
    Matrix T(n, m);
    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < m; j++)
        {
            T(i, j) = this->operator()(j, i);
        }
    }
    return T;
}